

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff88;
  InternalMetadataWithArena *in_stack_ffffffffffffff90;
  DescriptorProto *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffff90);
  *in_RDI = &PTR__DescriptorProto_00899b30;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x67b1d2);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x67b1e5);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)0x67b1fa);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)0x67b20f);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)0x67b224);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x67b239);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)0x67b251);
  this_00 = (DescriptorProto *)(in_RDI + 0x15);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)0x67b269);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x67b280);
  SharedCtor(this_00);
  return;
}

Assistant:

DescriptorProto::DescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.DescriptorProto)
}